

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbiscan.cpp
# Opt level: O0

void __thiscall icu_63::RBBIRuleScanner::nextChar(RBBIRuleScanner *this,RBBIRuleChar *c)

{
  int iVar1;
  UChar32 UVar2;
  int local_20;
  int32_t startX;
  int32_t i;
  int32_t commentStart;
  RBBIRuleChar *c_local;
  RBBIRuleScanner *this_local;
  
  this->fScanIndex = this->fNextIndex;
  UVar2 = nextCharLL(this);
  c->fChar = UVar2;
  c->fEscaped = '\0';
  if (c->fChar == 0x27) {
    UVar2 = UnicodeString::char32At(this->fRB->fRules,this->fNextIndex);
    if (UVar2 != 0x27) {
      this->fQuoteMode = (this->fQuoteMode != '\0' ^ 0xffU) & 1;
      if (this->fQuoteMode == '\x01') {
        c->fChar = 0x28;
      }
      else {
        c->fChar = 0x29;
      }
      c->fEscaped = '\0';
      return;
    }
    UVar2 = nextCharLL(this);
    c->fChar = UVar2;
    c->fEscaped = '\x01';
  }
  if (this->fQuoteMode == '\0') {
    if (c->fChar == 0x23) {
      local_20 = this->fScanIndex;
      while( true ) {
        UVar2 = nextCharLL(this);
        c->fChar = UVar2;
        if (((c->fChar == -1) || (c->fChar == 0xd)) || (c->fChar == 10)) break;
        if ((c->fChar == 0x85) || (c->fChar == 0x2028)) break;
      }
      for (; local_20 < this->fNextIndex + -1; local_20 = local_20 + 1) {
        UnicodeString::setCharAt(&this->fRB->fStrippedRules,local_20,L' ');
      }
    }
    if ((c->fChar != -1) && (c->fChar == 0x5c)) {
      c->fEscaped = '\x01';
      iVar1 = this->fNextIndex;
      UVar2 = UnicodeString::unescapeAt(this->fRB->fRules,&this->fNextIndex);
      c->fChar = UVar2;
      if (this->fNextIndex == iVar1) {
        error(this,U_BRK_HEX_DIGITS_EXPECTED);
      }
      this->fCharNum = (this->fNextIndex - iVar1) + this->fCharNum;
    }
  }
  else {
    c->fEscaped = '\x01';
  }
  return;
}

Assistant:

void RBBIRuleScanner::nextChar(RBBIRuleChar &c) {

    // Unicode Character constants needed for the processing done by nextChar(),
    //   in hex because literals wont work on EBCDIC machines.

    fScanIndex = fNextIndex;
    c.fChar    = nextCharLL();
    c.fEscaped = FALSE;

    //
    //  check for '' sequence.
    //  These are recognized in all contexts, whether in quoted text or not.
    //
    if (c.fChar == chApos) {
        if (fRB->fRules.char32At(fNextIndex) == chApos) {
            c.fChar    = nextCharLL();        // get nextChar officially so character counts
            c.fEscaped = TRUE;                //   stay correct.
        }
        else
        {
            // Single quote, by itself.
            //   Toggle quoting mode.
            //   Return either '('  or ')', because quotes cause a grouping of the quoted text.
            fQuoteMode = !fQuoteMode;
            if (fQuoteMode == TRUE) {
                c.fChar = chLParen;
            } else {
                c.fChar = chRParen;
            }
            c.fEscaped = FALSE;      // The paren that we return is not escaped.
            return;
        }
    }

    if (fQuoteMode) {
        c.fEscaped = TRUE;
    }
    else
    {
        // We are not in a 'quoted region' of the source.
        //
        if (c.fChar == chPound) {
            // Start of a comment.  Consume the rest of it.
            //  The new-line char that terminates the comment is always returned.
            //  It will be treated as white-space, and serves to break up anything
            //    that might otherwise incorrectly clump together with a comment in
            //    the middle (a variable name, for example.)
            int32_t commentStart = fScanIndex;
            for (;;) {
                c.fChar = nextCharLL();
                if (c.fChar == (UChar32)-1 ||  // EOF
                    c.fChar == chCR     ||
                    c.fChar == chLF     ||
                    c.fChar == chNEL    ||
                    c.fChar == chLS)       {break;}
            }
            for (int32_t i=commentStart; i<fNextIndex-1; ++i) {
                fRB->fStrippedRules.setCharAt(i, u' ');
            }
        }
        if (c.fChar == (UChar32)-1) {
            return;
        }

        //
        //  check for backslash escaped characters.
        //  Use UnicodeString::unescapeAt() to handle them.
        //
        if (c.fChar == chBackSlash) {
            c.fEscaped = TRUE;
            int32_t startX = fNextIndex;
            c.fChar = fRB->fRules.unescapeAt(fNextIndex);
            if (fNextIndex == startX) {
                error(U_BRK_HEX_DIGITS_EXPECTED);
            }
            fCharNum += fNextIndex-startX;
        }
    }
    // putc(c.fChar, stdout);
}